

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * operator*(Matrix4f *__return_storage_ptr__,Matrix4f *m,float f)

{
  float *pfVar1;
  undefined4 local_24;
  undefined4 local_20;
  int j;
  int i;
  float f_local;
  Matrix4f *m_local;
  Matrix4f *product;
  
  Matrix4f::Matrix4f(__return_storage_ptr__,m);
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      pfVar1 = Matrix4f::operator()(__return_storage_ptr__,local_20,local_24);
      *pfVar1 = f * *pfVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4f operator * (const Matrix4f& m, float f) {
	Matrix4f product(m); // zeroes

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
            product(i, j) *= f;
		}
	}
	return product;
}